

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O0

string * __thiscall pbrt::PaddedSobolSampler::ToString_abi_cxx11_(PaddedSobolSampler *this)

{
  string *in_RDI;
  int *in_stack_00000008;
  int *in_stack_00000010;
  Point2<int> *in_stack_00000020;
  char *in_stack_00000028;
  RandomizeStrategy *in_stack_00000040;
  
  StringPrintf<pbrt::Point2<int>const&,int_const&,int_const&,int_const&,pbrt::RandomizeStrategy_const&>
            (in_stack_00000028,in_stack_00000020,&this->samplesPerPixel,in_stack_00000010,
             in_stack_00000008,in_stack_00000040);
  return in_RDI;
}

Assistant:

std::string PaddedSobolSampler::ToString() const {
    return StringPrintf("[ PaddedSobolSampler pixel: %s sampleIndex: %d dimension: %d "
                        "samplesPerPixel: %d randomizeStrategy: %s ]",
                        pixel, sampleIndex, dimension, samplesPerPixel,
                        randomizeStrategy);
}